

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult __thiscall
MiniScript::Intrinsic::Execute
          (Intrinsic *this,long id,Context *context,IntrinsicResult *partialResult)

{
  long *plVar1;
  _func_IntrinsicResult_Context_ptr_IntrinsicResult *p_Var2;
  IntrinsicResultStorage *pIVar3;
  Intrinsic *pIVar4;
  
  pIVar4 = GetByID(id);
  p_Var2 = pIVar4->code;
  IntrinsicResult::ensureStorage(partialResult);
  pIVar3 = partialResult->rs;
  if (pIVar3 != (IntrinsicResultStorage *)0x0) {
    plVar1 = &(pIVar3->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + 1;
  }
  (*p_Var2)((Context *)this,(IntrinsicResult)context);
  if (pIVar3 != (IntrinsicResultStorage *)0x0) {
    plVar1 = &(pIVar3->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(pIVar3->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

IntrinsicResult Intrinsic::Execute(long id, Context *context, IntrinsicResult partialResult) {
		Intrinsic* item = GetByID(id);
		return item->code(context, partialResult);
	}